

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsConflictPool.cpp
# Opt level: O0

void __thiscall HighsConflictPool::performAging(HighsConflictPool *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  int *in_RDI;
  HighsInt in_stack_0000001c;
  HighsInt i;
  HighsInt numActiveConflicts;
  HighsInt agelim;
  HighsInt conflictMaxIndex;
  HighsConflictPool *in_stack_ffffffffffffffd0;
  vector<int,_std::allocator<int>_> *this_00;
  int local_18;
  int local_14;
  int local_10;
  
  sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     (in_RDI + 0x1a));
  local_10 = *in_RDI;
  local_14 = getNumConflicts(in_stack_ffffffffffffffd0);
  while( true ) {
    bVar1 = false;
    if (5 < local_10) {
      bVar1 = in_RDI[1] < local_14;
    }
    if (!bVar1) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_10);
    local_14 = local_14 - *pvVar4;
    local_10 = local_10 + -1;
  }
  for (local_18 = 0; local_18 != (int)sVar2; local_18 = local_18 + 1) {
    pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),(long)local_18);
    if (-1 < *pvVar3) {
      this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 2);
      pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),(long)local_18);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar3);
      *pvVar4 = *pvVar4 + -1;
      pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),(long)local_18);
      *pvVar3 = *pvVar3 + 1;
      pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),(long)local_18);
      if (local_10 < *pvVar3) {
        pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                           ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),(long)local_18);
        *pvVar3 = -1;
        removeConflict(_i,in_stack_0000001c);
      }
      else {
        pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                           ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),(long)local_18);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)*pvVar3);
        *pvVar4 = *pvVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void HighsConflictPool::performAging() {
  HighsInt conflictMaxIndex = conflictRanges_.size();
  HighsInt agelim = agelim_;
  HighsInt numActiveConflicts = getNumConflicts();
  while (agelim > 5 && numActiveConflicts > softlimit_) {
    numActiveConflicts -= ageDistribution_[agelim];
    --agelim;
  }

  for (HighsInt i = 0; i != conflictMaxIndex; ++i) {
    if (ages_[i] < 0) continue;

    ageDistribution_[ages_[i]] -= 1;
    ages_[i] += 1;

    if (ages_[i] > agelim) {
      ages_[i] = -1;
      removeConflict(i);
    } else
      ageDistribution_[ages_[i]] += 1;
  }
}